

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O0

grid_iterator<signed_char> * __thiscall
idx2::grid_iterator<signed_char>::operator++(grid_iterator<signed_char> *this)

{
  grid_iterator<signed_char> *this_local;
  
  (this->P).field_0.field_0.X = (this->S).field_0.field_0.X + (this->P).field_0.field_0.X;
  this->Ptr = this->Ptr + (this->S).field_0.field_0.X;
  if ((this->D).field_0.field_0.X <= (this->P).field_0.field_0.X) {
    (this->P).field_0.field_0.X = 0;
    (this->P).field_0.field_0.Y = (this->S).field_0.field_0.Y + (this->P).field_0.field_0.Y;
    this->Ptr = this->Ptr +
                ((long)((this->N).field_0.field_0.X * (this->S).field_0.field_0.Y) -
                (long)(this->D).field_0.field_0.X);
    if ((this->D).field_0.field_0.Y <= (this->P).field_0.field_0.Y) {
      (this->P).field_0.field_0.Y = 0;
      (this->P).field_0.field_0.Z = (this->S).field_0.field_0.Z + (this->P).field_0.field_0.Z;
      this->Ptr = this->Ptr +
                  ((long)(this->S).field_0.field_0.Z * (long)(this->N).field_0.field_0.X *
                   (long)(this->N).field_0.field_0.Y -
                  (long)(this->D).field_0.field_0.Y * (long)(this->N).field_0.field_0.X);
    }
  }
  return this;
}

Assistant:

grid_iterator<t>&
grid_iterator<t>::operator++()
{
  P.X += S.X;
  Ptr += S.X;
  if (P.X >= D.X)
  {
    P.X = 0;
    P.Y += S.Y;
    Ptr = Ptr - D.X + (N.X * S.Y);
    if (P.Y >= D.Y)
    {
      P.Y = 0;
      P.Z += S.Z;
      Ptr = Ptr - D.Y * i64(N.X) + S.Z * i64(N.X) * N.Y;
    }
  }
  return *this;
}